

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O1

void __thiscall MotionInit::Print(MotionInit *this,ostream *out)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Init: v = ",10);
  poVar1 = std::ostream::_M_insert<double>((this->super_MotionBase).vf);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Print(std::ostream &out) const
    { out << "Init: v = " << vf << std::endl; }